

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datatypes-tests.cpp
# Opt level: O0

void check<std::__cxx11::string>
               (unique_ptr<groundupdb::IDatabase,_std::default_delete<groundupdb::IDatabase>_> *db,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v)

{
  bool bVar1;
  pointer pIVar2;
  size_t local_710;
  size_t local_708;
  Decomposer local_6f9;
  unsigned_long *local_6f8;
  BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&> local_6f0;
  StringRef local_6c0;
  SourceLineInfo local_6b0;
  StringRef local_6a0;
  undefined1 local_690 [8];
  AssertionHandler catchAssertionHandler_7;
  int local_640;
  Decomposer local_639;
  int *local_638;
  BinaryExpr<const_int_&,_const_unsigned_long_&> local_630;
  StringRef local_600;
  SourceLineInfo local_5f0;
  StringRef local_5e0;
  undefined1 local_5d0 [8];
  AssertionHandler catchAssertionHandler_6;
  int local_580;
  Decomposer local_579;
  int *local_578;
  BinaryExpr<const_int_&,_const_unsigned_long_&> local_570;
  StringRef local_540;
  SourceLineInfo local_530;
  StringRef local_520;
  undefined1 local_510 [8];
  AssertionHandler catchAssertionHandler_5;
  size_t local_4c0;
  Decomposer local_4b1;
  unsigned_long *local_4b0;
  BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&> local_4a8;
  StringRef local_478;
  SourceLineInfo local_468;
  StringRef local_458;
  undefined1 local_448 [8];
  AssertionHandler catchAssertionHandler_4;
  int local_3f8;
  Decomposer local_3f1;
  int *local_3f0;
  BinaryExpr<const_int_&,_const_unsigned_long_&> local_3e8;
  StringRef local_3b8;
  SourceLineInfo local_3a8;
  StringRef local_398;
  undefined1 local_388 [8];
  AssertionHandler catchAssertionHandler_3;
  int local_338;
  Decomposer local_331;
  int *local_330;
  BinaryExpr<const_int_&,_const_unsigned_long_&> local_328;
  StringRef local_2f8;
  SourceLineInfo local_2e8;
  StringRef local_2d8;
  undefined1 local_2c8 [8];
  AssertionHandler catchAssertionHandler_2;
  StringRef local_278;
  SourceLineInfo local_268;
  StringRef local_258;
  undefined1 local_248 [8];
  AssertionHandler catchAssertionHandler_1;
  StringRef local_1f8;
  SourceLineInfo local_1e8;
  StringRef local_1d8;
  undefined1 local_1c8 [8];
  AssertionHandler catchAssertionHandler;
  HashedValue local_160;
  undefined1 local_128 [8];
  EncodedValue evr;
  HashedValue local_c8;
  undefined1 local_90 [8];
  EncodedValue ev;
  allocator<char> local_39;
  string local_38 [8];
  string k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_local;
  unique_ptr<groundupdb::IDatabase,_std::default_delete<groundupdb::IDatabase>_> *db_local;
  
  k.field_2._8_8_ = v;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"testkey",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  groundupdb::EncodedValue::EncodedValue((EncodedValue *)local_90,v);
  pIVar2 = Catch::clara::std::
           unique_ptr<groundupdb::IDatabase,_std::default_delete<groundupdb::IDatabase>_>::
           operator->((unique_ptr<groundupdb::IDatabase,_std::default_delete<groundupdb::IDatabase>_>
                       *)db);
  std::__cxx11::string::string((string *)&evr.m_value.m_hash,local_38);
  groundupdb::HashedValue::HashedValue<std::__cxx11::string>
            (&local_c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &evr.m_value.m_hash);
  (*pIVar2->_vptr_IDatabase[3])(pIVar2,&local_c8,local_90);
  groundupdb::HashedValue::~HashedValue(&local_c8);
  std::__cxx11::string::~string((string *)&evr.m_value.m_hash);
  pIVar2 = Catch::clara::std::
           unique_ptr<groundupdb::IDatabase,_std::default_delete<groundupdb::IDatabase>_>::
           operator->((unique_ptr<groundupdb::IDatabase,_std::default_delete<groundupdb::IDatabase>_>
                       *)db);
  std::__cxx11::string::string((string *)&catchAssertionHandler.m_resultCapture,local_38);
  groundupdb::HashedValue::HashedValue<std::__cxx11::string>
            (&local_160,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &catchAssertionHandler.m_resultCapture);
  (*pIVar2->_vptr_IDatabase[5])(local_128,pIVar2,&local_160);
  groundupdb::HashedValue::~HashedValue(&local_160);
  std::__cxx11::string::~string((string *)&catchAssertionHandler.m_resultCapture);
  local_1d8 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_1e8,
             "/workspace/llm4binary/github/license_c_cmakelists/adamfowleruk[P]groundupdb/groundupdb-tests/datatypes-tests.cpp"
             ,0x3f);
  Catch::StringRef::StringRef(&local_1f8,"ev.hasValue()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_1c8,&local_1d8,&local_1e8,local_1f8,Normal);
  bVar1 = groundupdb::EncodedValue::hasValue((EncodedValue *)local_90);
  catchAssertionHandler_1.m_resultCapture._7_1_ =
       Catch::Decomposer::operator<=
                 ((Decomposer *)((long)&catchAssertionHandler_1.m_resultCapture + 6),bVar1);
  Catch::AssertionHandler::handleExpr<bool>
            ((AssertionHandler *)local_1c8,
             (ExprLhs<bool> *)((long)&catchAssertionHandler_1.m_resultCapture + 7));
  Catch::AssertionHandler::complete((AssertionHandler *)local_1c8);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1c8);
  local_258 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_268,
             "/workspace/llm4binary/github/license_c_cmakelists/adamfowleruk[P]groundupdb/groundupdb-tests/datatypes-tests.cpp"
             ,0x40);
  Catch::StringRef::StringRef(&local_278,"evr.hasValue()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_248,&local_258,&local_268,local_278,Normal);
  bVar1 = groundupdb::EncodedValue::hasValue((EncodedValue *)local_128);
  catchAssertionHandler_2.m_resultCapture._7_1_ =
       Catch::Decomposer::operator<=
                 ((Decomposer *)((long)&catchAssertionHandler_2.m_resultCapture + 6),bVar1);
  Catch::AssertionHandler::handleExpr<bool>
            ((AssertionHandler *)local_248,
             (ExprLhs<bool> *)((long)&catchAssertionHandler_2.m_resultCapture + 7));
  Catch::AssertionHandler::complete((AssertionHandler *)local_248);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_248);
  local_2d8 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_2e8,
             "/workspace/llm4binary/github/license_c_cmakelists/adamfowleruk[P]groundupdb/groundupdb-tests/datatypes-tests.cpp"
             ,0x41);
  Catch::StringRef::StringRef(&local_2f8,"0 != ev.hash()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2c8,&local_2d8,&local_2e8,local_2f8,Normal);
  local_338 = 0;
  local_330 = (int *)Catch::Decomposer::operator<=(&local_331,&local_338);
  catchAssertionHandler_3.m_resultCapture =
       (IResultCapture *)groundupdb::EncodedValue::hash((EncodedValue *)local_90);
  Catch::ExprLhs<int_const&>::operator!=
            (&local_328,(ExprLhs<int_const&> *)&local_330,
             (unsigned_long *)&catchAssertionHandler_3.m_resultCapture);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2c8,&local_328.super_ITransientExpression);
  Catch::BinaryExpr<const_int_&,_const_unsigned_long_&>::~BinaryExpr(&local_328);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2c8);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_2c8);
  local_398 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_3a8,
             "/workspace/llm4binary/github/license_c_cmakelists/adamfowleruk[P]groundupdb/groundupdb-tests/datatypes-tests.cpp"
             ,0x42);
  Catch::StringRef::StringRef(&local_3b8,"0 != evr.hash()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_388,&local_398,&local_3a8,local_3b8,Normal);
  local_3f8 = 0;
  local_3f0 = (int *)Catch::Decomposer::operator<=(&local_3f1,&local_3f8);
  catchAssertionHandler_4.m_resultCapture =
       (IResultCapture *)groundupdb::EncodedValue::hash((EncodedValue *)local_128);
  Catch::ExprLhs<int_const&>::operator!=
            (&local_3e8,(ExprLhs<int_const&> *)&local_3f0,
             (unsigned_long *)&catchAssertionHandler_4.m_resultCapture);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_388,&local_3e8.super_ITransientExpression);
  Catch::BinaryExpr<const_int_&,_const_unsigned_long_&>::~BinaryExpr(&local_3e8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_388);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_388);
  local_458 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_468,
             "/workspace/llm4binary/github/license_c_cmakelists/adamfowleruk[P]groundupdb/groundupdb-tests/datatypes-tests.cpp"
             ,0x43);
  Catch::StringRef::StringRef(&local_478,"ev.hash() == evr.hash()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_448,&local_458,&local_468,local_478,Normal);
  local_4c0 = groundupdb::EncodedValue::hash((EncodedValue *)local_90);
  local_4b0 = (unsigned_long *)Catch::Decomposer::operator<=(&local_4b1,&local_4c0);
  catchAssertionHandler_5.m_resultCapture =
       (IResultCapture *)groundupdb::EncodedValue::hash((EncodedValue *)local_128);
  Catch::ExprLhs<unsigned_long_const&>::operator==
            (&local_4a8,(ExprLhs<unsigned_long_const&> *)&local_4b0,
             (unsigned_long *)&catchAssertionHandler_5.m_resultCapture);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_448,&local_4a8.super_ITransientExpression);
  Catch::BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&>::~BinaryExpr(&local_4a8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_448);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_448);
  local_520 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_530,
             "/workspace/llm4binary/github/license_c_cmakelists/adamfowleruk[P]groundupdb/groundupdb-tests/datatypes-tests.cpp"
             ,0x44);
  Catch::StringRef::StringRef(&local_540,"0 != ev.length()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_510,&local_520,&local_530,local_540,Normal);
  local_580 = 0;
  local_578 = (int *)Catch::Decomposer::operator<=(&local_579,&local_580);
  catchAssertionHandler_6.m_resultCapture =
       (IResultCapture *)groundupdb::EncodedValue::length((EncodedValue *)local_90);
  Catch::ExprLhs<int_const&>::operator!=
            (&local_570,(ExprLhs<int_const&> *)&local_578,
             (unsigned_long *)&catchAssertionHandler_6.m_resultCapture);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_510,&local_570.super_ITransientExpression);
  Catch::BinaryExpr<const_int_&,_const_unsigned_long_&>::~BinaryExpr(&local_570);
  Catch::AssertionHandler::complete((AssertionHandler *)local_510);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_510);
  local_5e0 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_5f0,
             "/workspace/llm4binary/github/license_c_cmakelists/adamfowleruk[P]groundupdb/groundupdb-tests/datatypes-tests.cpp"
             ,0x45);
  Catch::StringRef::StringRef(&local_600,"0 != evr.length()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_5d0,&local_5e0,&local_5f0,local_600,Normal);
  local_640 = 0;
  local_638 = (int *)Catch::Decomposer::operator<=(&local_639,&local_640);
  catchAssertionHandler_7.m_resultCapture =
       (IResultCapture *)groundupdb::EncodedValue::length((EncodedValue *)local_128);
  Catch::ExprLhs<int_const&>::operator!=
            (&local_630,(ExprLhs<int_const&> *)&local_638,
             (unsigned_long *)&catchAssertionHandler_7.m_resultCapture);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_5d0,&local_630.super_ITransientExpression);
  Catch::BinaryExpr<const_int_&,_const_unsigned_long_&>::~BinaryExpr(&local_630);
  Catch::AssertionHandler::complete((AssertionHandler *)local_5d0);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_5d0);
  local_6a0 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_6b0,
             "/workspace/llm4binary/github/license_c_cmakelists/adamfowleruk[P]groundupdb/groundupdb-tests/datatypes-tests.cpp"
             ,0x46);
  Catch::StringRef::StringRef(&local_6c0,"ev.length() == evr.length()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_690,&local_6a0,&local_6b0,local_6c0,Normal);
  local_708 = groundupdb::EncodedValue::length((EncodedValue *)local_90);
  local_6f8 = (unsigned_long *)Catch::Decomposer::operator<=(&local_6f9,&local_708);
  local_710 = groundupdb::EncodedValue::length((EncodedValue *)local_128);
  Catch::ExprLhs<unsigned_long_const&>::operator==
            (&local_6f0,(ExprLhs<unsigned_long_const&> *)&local_6f8,&local_710);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_690,&local_6f0.super_ITransientExpression);
  Catch::BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&>::~BinaryExpr(&local_6f0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_690);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_690);
  groundupdb::EncodedValue::~EncodedValue((EncodedValue *)local_128);
  groundupdb::EncodedValue::~EncodedValue((EncodedValue *)local_90);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void check(const std::unique_ptr<groundupdb::IDatabase> &db, T v) {
  std::string k("testkey");
  groundupdb::EncodedValue ev(v);
  db->setKeyValue(k, std::move(ev));
  groundupdb::EncodedValue evr = db->getKeyValue(k);
  REQUIRE(ev.hasValue());
  REQUIRE(evr.hasValue());
  REQUIRE(0 != ev.hash());
  REQUIRE(0 != evr.hash());
  REQUIRE(ev.hash() == evr.hash());
  REQUIRE(0 != ev.length());
  REQUIRE(0 != evr.length());
  REQUIRE(ev.length() == evr.length());
}